

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmPreModify(ExpressionContext *ctx,VmModule *module,ExprPreModify *node)

{
  SynBase *pSVar1;
  bool bVar2;
  VmValue *pVVar3;
  TypeRef *pTVar4;
  VmConstant *pVVar5;
  int value_00;
  longlong value_01;
  double local_58;
  VmValue *local_38;
  VmValue *value;
  TypeRef *refType;
  VmValue *address;
  ExprPreModify *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar3 = CompileVm(ctx,module,node->value);
  pTVar4 = getType<TypeRef>(node->value->type);
  if (pTVar4 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa58,
                  "VmValue *CompileVmPreModify(ExpressionContext &, VmModule *, ExprPreModify *)");
  }
  local_38 = anon_unknown.dwarf_aa461::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,pTVar4->subType,pVVar3,0);
  bVar2 = VmType::operator==(&local_38->type,&VmType::Int);
  if (bVar2) {
    pSVar1 = (node->super_ExprBase).source;
    value_00 = -1;
    if ((node->isIncrement & 1U) != 0) {
      value_00 = 1;
    }
    pVVar5 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,value_00);
    local_38 = anon_unknown.dwarf_aa461::CreateAdd(module,pSVar1,local_38,&pVVar5->super_VmValue);
  }
  else {
    bVar2 = VmType::operator==(&local_38->type,&VmType::Double);
    if (bVar2) {
      pSVar1 = (node->super_ExprBase).source;
      local_58 = 1.0;
      if ((node->isIncrement & 1U) == 0) {
        local_58 = -1.0;
      }
      pVVar5 = CreateConstantDouble(module->allocator,(node->super_ExprBase).source,local_58);
      local_38 = anon_unknown.dwarf_aa461::CreateAdd(module,pSVar1,local_38,&pVVar5->super_VmValue);
    }
    else {
      bVar2 = VmType::operator==(&local_38->type,&VmType::Long);
      if (bVar2) {
        pSVar1 = (node->super_ExprBase).source;
        value_01 = -1;
        if ((node->isIncrement & 1U) != 0) {
          value_01 = 1;
        }
        pVVar5 = CreateConstantLong(module->allocator,(node->super_ExprBase).source,value_01);
        local_38 = anon_unknown.dwarf_aa461::CreateAdd
                             (module,pSVar1,local_38,&pVVar5->super_VmValue);
      }
    }
  }
  anon_unknown.dwarf_aa461::CreateStore
            (ctx,module,(node->super_ExprBase).source,pTVar4->subType,pVVar3,local_38,0);
  pVVar3 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,local_38);
  return pVVar3;
}

Assistant:

VmValue* CompileVmPreModify(ExpressionContext &ctx, VmModule *module, ExprPreModify *node)
{
	VmValue *address = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	VmValue *value = CreateLoad(ctx, module, node->source, refType->subType, address, 0);

	if(value->type == VmType::Int)
		value = CreateAdd(module, node->source, value, CreateConstantInt(module->allocator, node->source, node->isIncrement ? 1 : -1));
	else if(value->type == VmType::Double)
		value = CreateAdd(module, node->source, value, CreateConstantDouble(module->allocator, node->source, node->isIncrement ? 1.0 : -1.0));
	else if(value->type == VmType::Long)
		value = CreateAdd(module, node->source, value, CreateConstantLong(module->allocator, node->source, node->isIncrement ? 1ll : -1ll));
	else
		assert("!unknown type");

	CreateStore(ctx, module, node->source, refType->subType, address, value, 0);

	return CheckType(ctx, node, value);
}